

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TextureSwizzle::SmokeTest::isTargetSupported(SmokeTest *this,size_t target_idx)

{
  if ((*(uint *)(texture_targets + target_idx * 0x30 + 0x28) | 2) == 0x9102) {
    return this->m_is_ms_supported;
  }
  return true;
}

Assistant:

bool SmokeTest::isTargetSupported(size_t target_idx)
{
	const _texture_target& target = texture_targets[target_idx];

	bool is_supported = true;

	switch (target.m_target)
	{
	case GL_TEXTURE_2D_MULTISAMPLE:
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		is_supported = m_is_ms_supported;
		break;

	default:
		break;
	}

	return is_supported;
}